

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *pGVar1;
  byte *pbVar2;
  char cVar3;
  char *pcVar4;
  Ch *pCVar5;
  Ch *pCVar6;
  bool bVar7;
  int iVar8;
  bool bVar9;
  undefined4 uVar10;
  int iVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar12;
  byte *pbVar13;
  ulong uVar14;
  uint16_t uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  SizeType SVar19;
  int iVar20;
  byte bVar21;
  uint uVar22;
  byte bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  Number NVar29;
  
  bVar21 = *is->src_;
  if (bVar21 < 0x6e) {
    if (bVar21 == 0x22) {
      ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar21 != 0x5b) {
      if (bVar21 != 0x66) {
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar4 = is->src_;
      if (*pcVar4 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x372,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      is->src_ = pcVar4 + 1;
      if ((((pcVar4[1] == 'a') && (is->src_ = pcVar4 + 2, pcVar4[2] == 'l')) &&
          (is->src_ = pcVar4 + 3, pcVar4[3] == 's')) && (is->src_ = pcVar4 + 4, pcVar4[4] == 'e')) {
        is->src_ = pcVar4 + 5;
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).n = (Number)0x0;
        (pGVar12->data_).s.str = (Ch *)0x0;
        (pGVar12->data_).f.flags = 9;
      }
      else {
        ParseFalse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
      }
      return;
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x328,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar12->data_).n = (Number)0x0;
    (pGVar12->data_).s.str = (Ch *)0x0;
    (pGVar12->data_).f.flags = 4;
    pbVar13 = (byte *)is->src_;
    while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
      pbVar13 = pbVar13 + 1;
    }
    is->src_ = (Ch *)pbVar13;
    if (*(int *)(this + 0x30) == 0) {
      pGVar1 = this + 0x30;
      if (*pbVar13 == 0x5d) {
        is->src_ = (Ch *)(pbVar13 + 1);
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,0);
        if (!bVar9) {
          ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (pGVar1);
LAB_00660fa4:
          uVar10 = 0x10;
LAB_00660fa9:
          pCVar5 = is->src_;
          pCVar6 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar10;
          *(long *)(this + 0x38) = (long)pCVar5 - (long)pCVar6;
        }
      }
      else {
        SVar19 = 0;
        do {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar13 = (byte *)is->src_;
          while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)))
          {
            pbVar13 = pbVar13 + 1;
          }
          is->src_ = (Ch *)pbVar13;
          if (*(int *)pGVar1 != 0) {
            return;
          }
          SVar19 = SVar19 + 1;
          if (*pbVar13 != 0x2c) {
            if (*is->src_ != ']') {
              ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                        (pGVar1);
              uVar10 = 7;
              goto LAB_00660fa9;
            }
            is->src_ = is->src_ + 1;
            bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndArray(handler,SVar19);
            if (bVar9) {
              return;
            }
            ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (pGVar1);
            goto LAB_00660fa4;
          }
          pbVar13 = pbVar13 + 1;
          is->src_ = (Ch *)pbVar13;
          while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)))
          {
            pbVar13 = pbVar13 + 1;
          }
          is->src_ = (Ch *)pbVar13;
        } while (*(int *)pGVar1 == 0);
      }
    }
    return;
  }
  if (bVar21 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x2e4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar12->data_).n = (Number)0x0;
    (pGVar12->data_).s.str = (Ch *)0x0;
    (pGVar12->data_).f.flags = 3;
    pbVar13 = (byte *)is->src_;
    while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
      pbVar13 = pbVar13 + 1;
    }
    is->src_ = (Ch *)pbVar13;
    if (*(int *)(this + 0x30) == 0) {
      pGVar1 = this + 0x30;
      if (*pbVar13 == 0x7d) {
        is->src_ = (Ch *)(pbVar13 + 1);
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndObject(handler,0);
        if (!bVar9) {
          if (*(int *)pGVar1 != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x2ef,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
LAB_00660dc0:
          pbVar13 = (byte *)is->src_;
          uVar10 = 0x10;
LAB_00660e14:
          pCVar5 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar10;
          *(long *)(this + 0x38) = (long)pbVar13 - (long)pCVar5;
        }
      }
      else {
        SVar19 = 0;
        do {
          pbVar13 = (byte *)is->src_;
          if (*pbVar13 != 0x22) {
            ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (pGVar1);
            uVar10 = 4;
            goto LAB_00660e14;
          }
          ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar13 = (byte *)is->src_;
          while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)))
          {
            pbVar13 = pbVar13 + 1;
          }
          is->src_ = (Ch *)pbVar13;
          if (*(int *)pGVar1 != 0) {
            return;
          }
          if (*pbVar13 != 0x3a) {
            if (*(int *)pGVar1 != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                            ,0x2fe,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            pbVar13 = (byte *)is->src_;
            uVar10 = 5;
            goto LAB_00660e14;
          }
          pbVar13 = pbVar13 + 1;
          is->src_ = (Ch *)pbVar13;
          while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)))
          {
            pbVar13 = pbVar13 + 1;
          }
          is->src_ = (Ch *)pbVar13;
          if (*(int *)pGVar1 != 0) {
            return;
          }
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar13 = (byte *)is->src_;
          while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)))
          {
            pbVar13 = pbVar13 + 1;
          }
          is->src_ = (Ch *)pbVar13;
          if (*(int *)pGVar1 != 0) {
            return;
          }
          SVar19 = SVar19 + 1;
          if (*pbVar13 != 0x2c) {
            if (*pbVar13 != 0x7d) {
              uVar10 = 6;
              goto LAB_00660e14;
            }
            is->src_ = (Ch *)(pbVar13 + 1);
            bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndObject(handler,SVar19);
            if (bVar9) {
              return;
            }
            if (*(int *)pGVar1 != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                            ,0x314,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_00660dc0;
          }
          pbVar13 = pbVar13 + 1;
          is->src_ = (Ch *)pbVar13;
          while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)))
          {
            pbVar13 = pbVar13 + 1;
          }
          is->src_ = (Ch *)pbVar13;
        } while (*(int *)pGVar1 == 0);
      }
    }
    return;
  }
  if (bVar21 == 0x74) {
    pcVar4 = is->src_;
    if (*pcVar4 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x365,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = pcVar4 + 1;
    if (((pcVar4[1] == 'r') && (is->src_ = pcVar4 + 2, pcVar4[2] == 'u')) &&
       (is->src_ = pcVar4 + 3, pcVar4[3] == 'e')) {
      is->src_ = pcVar4 + 4;
      pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar12->data_).n = (Number)0x0;
      (pGVar12->data_).s.str = (Ch *)0x0;
      (pGVar12->data_).f.flags = 10;
    }
    else {
      ParseTrue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
    }
    return;
  }
  if (bVar21 == 0x6e) {
    ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pcVar4 = is->src_;
  pCVar5 = is->dst_;
  pCVar6 = is->head_;
  cVar3 = *pcVar4;
  pbVar13 = (byte *)(pcVar4 + (cVar3 == '-'));
  bVar21 = pcVar4[cVar3 == '-'];
  if (bVar21 == 0x30) {
    pbVar13 = pbVar13 + 1;
    uVar18 = 0;
    bVar9 = false;
    iVar11 = 0;
    uVar22 = 0;
  }
  else {
    if (8 < (byte)(bVar21 - 0x31)) {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      goto LAB_0066178c;
    }
    uVar22 = bVar21 - 0x30;
    bVar21 = pbVar13[1];
    pbVar13 = pbVar13 + 1;
    if (cVar3 == '-') {
      if (9 < (byte)(bVar21 - 0x30)) {
LAB_00661599:
        uVar18 = 0;
        bVar9 = false;
        iVar11 = 0;
        goto LAB_00661115;
      }
      iVar11 = 0;
      do {
        if ((0xccccccb < uVar22) && ('8' < (char)bVar21 || uVar22 != 0xccccccc)) goto LAB_0066110b;
        uVar22 = ((uint)bVar21 + uVar22 * 10) - 0x30;
        iVar11 = iVar11 + 1;
        bVar21 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      } while ((byte)(bVar21 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar21 - 0x30)) goto LAB_00661599;
      iVar11 = 0;
      do {
        if ((0x19999998 < uVar22) && ('5' < (char)bVar21 || uVar22 != 0x19999999))
        goto LAB_0066110b;
        uVar22 = ((uint)bVar21 + uVar22 * 10) - 0x30;
        iVar11 = iVar11 + 1;
        bVar21 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      } while ((byte)(bVar21 - 0x30) < 10);
    }
    bVar9 = false;
    uVar18 = 0;
  }
LAB_00661115:
  uVar14 = (ulong)uVar18;
  dVar28 = 0.0;
  if (bVar9) {
    bVar21 = *pbVar13;
    if (cVar3 == '-') {
      if (9 < (byte)(bVar21 - 0x30)) goto LAB_0066121a;
      do {
        if ((0xccccccccccccccb < uVar14) && (uVar14 != 0xccccccccccccccc || '8' < (char)bVar21))
        goto LAB_006611f4;
        uVar14 = (ulong)(bVar21 & 0xf) + uVar14 * 10;
        iVar11 = iVar11 + 1;
        bVar21 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      } while ((byte)(bVar21 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar21 - 0x30)) goto LAB_0066121a;
      do {
        if ((0x1999999999999998 < uVar14) && (uVar14 != 0x1999999999999999 || '5' < (char)bVar21))
        goto LAB_006611f4;
        uVar14 = (ulong)(bVar21 & 0xf) + uVar14 * 10;
        iVar11 = iVar11 + 1;
        bVar21 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      } while ((byte)(bVar21 - 0x30) < 10);
    }
    bVar7 = false;
  }
  else {
LAB_0066121a:
    bVar7 = false;
  }
LAB_0066122c:
  if (bVar7) {
    bVar21 = *pbVar13;
    while ((byte)(bVar21 - 0x30) < 10) {
      if (1.7976931348623158e+307 <= dVar28) {
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        goto LAB_0066178c;
      }
      dVar28 = dVar28 * 10.0 + (double)((char)*pbVar13 + -0x30);
      bVar21 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
    }
  }
  bVar21 = *pbVar13;
  pbVar13 = pbVar13 + (bVar21 == 0x2e);
  iVar20 = 0;
  uVar16 = uVar14;
  if (bVar21 == 0x2e) {
    if ((byte)(*pbVar13 - 0x3a) < 0xf6) {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      goto LAB_0066178c;
    }
    iVar20 = 0;
    if (!bVar7) {
      uVar16 = (ulong)uVar22;
      if (bVar9) {
        uVar16 = uVar14;
      }
      bVar21 = *pbVar13;
      iVar20 = 0;
      if ((0xf5 < (byte)(bVar21 - 0x3a)) && (iVar20 = 0, uVar16 < 0x20000000000000)) {
        lVar17 = 0;
        do {
          uVar16 = (ulong)(bVar21 & 0xf) + uVar16 * 10;
          iVar11 = (uint)(uVar16 != 0) + iVar11;
          bVar21 = pbVar13[lVar17 + 1];
          lVar17 = lVar17 + 1;
          if ((byte)(bVar21 - 0x3a) < 0xf6) break;
        } while (uVar16 < 0x20000000000000);
        iVar20 = -(int)lVar17;
        pbVar13 = pbVar13 + lVar17;
      }
      auVar26._8_4_ = (int)(uVar16 >> 0x20);
      auVar26._0_8_ = uVar16;
      auVar26._12_4_ = 0x45300000;
      dVar28 = (auVar26._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
      bVar7 = true;
    }
    bVar21 = *pbVar13;
    while ((byte)(bVar21 - 0x30) < 10) {
      if (iVar11 < 0x11) {
        dVar28 = dVar28 * 10.0 + (double)(int)(bVar21 - 0x30);
        iVar20 = iVar20 + -1;
        if (0.0 < dVar28) {
          iVar11 = iVar11 + 1;
        }
      }
      pbVar2 = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
      bVar21 = *pbVar2;
    }
  }
  bVar21 = *pbVar13;
  pbVar13 = pbVar13 + (bVar21 == 0x65);
  if (bVar21 == 0x65) {
LAB_006613d5:
    uVar14 = (ulong)uVar22;
    if (bVar9) {
      uVar14 = uVar16;
    }
    if (!bVar7) {
      auVar27._8_4_ = (int)(uVar14 >> 0x20);
      auVar27._0_8_ = uVar14;
      auVar27._12_4_ = 0x45300000;
      dVar28 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
      bVar7 = true;
    }
    bVar21 = *pbVar13;
    pbVar13 = pbVar13 + (bVar21 == 0x2b);
    if (bVar21 == 0x2b) {
      bVar24 = false;
    }
    else {
      bVar24 = *pbVar13 == 0x2d;
      pbVar13 = pbVar13 + bVar24;
    }
    bVar21 = *pbVar13;
    if ((byte)(bVar21 - 0x30) < 10) {
      pbVar13 = pbVar13 + 1;
      iVar11 = bVar21 - 0x30;
      if (bVar24) {
        bVar21 = *pbVar13;
        while ((byte)(bVar21 - 0x30) < 10) {
          iVar11 = (uint)bVar21 + iVar11 * 10 + -0x30;
          if (iVar11 < 0xccccccc) {
            pbVar13 = pbVar13 + 1;
          }
          else {
            do {
              pbVar2 = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
            } while ((byte)(*pbVar2 - 0x30) < 10);
          }
          bVar21 = *pbVar13;
        }
      }
      else {
        do {
          bVar21 = *pbVar13;
          bVar23 = bVar21 - 0x30;
          if (9 < bVar23) goto LAB_00661508;
          pbVar13 = pbVar13 + 1;
          iVar11 = (uint)bVar21 + iVar11 * 10 + -0x30;
        } while (iVar11 <= 0x134 - iVar20);
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
LAB_00661508:
        if (bVar23 < 10) {
          bVar24 = false;
          goto LAB_006615b8;
        }
      }
      iVar8 = -iVar11;
      if (!bVar24) {
        iVar8 = iVar11;
      }
      iVar11 = iVar8;
      bVar24 = true;
    }
    else {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      bVar24 = false;
      iVar11 = 0;
    }
LAB_006615b8:
    if (!bVar24) goto LAB_0066178c;
  }
  else {
    bVar21 = *pbVar13;
    pbVar13 = pbVar13 + (bVar21 == 0x45);
    iVar11 = 0;
    if (bVar21 == 0x45) goto LAB_006613d5;
  }
  if (!bVar7) {
    if (bVar9) {
      if (cVar3 == '-') {
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar16);
        if (!bVar9) {
          ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
        }
        goto LAB_0066178c;
      }
      pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar12->data_).n = (Number)0x0;
      (pGVar12->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar12->data_ = uVar16;
      uVar15 = (ushort)((uVar16 & 0xffffffff80000000) == 0) * 0x20 +
               ((ushort)(uVar16 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar16) << 7) + 0x116;
    }
    else {
      if (cVar3 == '-') {
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).n = (Number)0x0;
        (pGVar12->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar12->data_ = (long)(int)-uVar22;
        uVar15 = 0xb6;
        if ((int)uVar22 < 1) {
          uVar15 = 0x1f6;
        }
        (pGVar12->data_).f.flags = uVar15;
        goto LAB_0066178c;
      }
      pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar12->data_).n = (Number)0x0;
      (pGVar12->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar12->data_ = (ulong)uVar22;
      uVar15 = (ushort)(-1 < (int)uVar22) << 5 | 0x1d6;
    }
    (pGVar12->data_).f.flags = uVar15;
    goto LAB_0066178c;
  }
  uVar18 = iVar11 + iVar20;
  if ((int)uVar18 < -0x134) {
    NVar29.i64 = 0;
    if (-0x269 < (int)uVar18) {
      uVar18 = -uVar18 - 0x134;
      if (0x134 < uVar18) goto LAB_006617b3;
      dVar28 = dVar28 / 1e+308;
LAB_0066173e:
      NVar29.d = dVar28 / *(double *)(internal::Pow10(int)::e + (ulong)uVar18 * 8);
    }
  }
  else {
    if ((int)uVar18 < 0) {
      uVar18 = -uVar18;
      if (0x134 < uVar18) goto LAB_006617b3;
      goto LAB_0066173e;
    }
    if (0x134 < uVar18) {
LAB_006617b3:
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    NVar29.d = dVar28 * *(double *)(internal::Pow10(int)::e + (ulong)uVar18 * 8);
  }
  pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  if (cVar3 == '-') {
    NVar29.u64 = NVar29.u64 ^ 0x8000000000000000;
  }
  (pGVar12->data_).n = (Number)0x0;
  (pGVar12->data_).s.str = (Ch *)0x0;
  (pGVar12->data_).n = NVar29;
  (pGVar12->data_).f.flags = 0x216;
LAB_0066178c:
  is->src_ = (Ch *)pbVar13;
  is->dst_ = pCVar5;
  is->head_ = pCVar6;
  return;
LAB_0066110b:
  bVar9 = true;
  uVar18 = uVar22;
  goto LAB_00661115;
LAB_006611f4:
  auVar25._8_4_ = (int)(uVar14 >> 0x20);
  auVar25._0_8_ = uVar14;
  auVar25._12_4_ = 0x45300000;
  dVar28 = (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
  bVar7 = true;
  goto LAB_0066122c;
}

Assistant:

Ch Peek() { return *src_; }